

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_copy_to_ucol.h
# Opt level: O0

int __thiscall
Eigen::internal::SparseLUImpl<double,_int>::copy_to_ucol
          (SparseLUImpl<double,_int> *this,int jcol,int nseg,IndexVector *segrep,
          BlockIndexVector *repfnz,IndexVector *perm_r,BlockScalarVector *dense,GlobalLU_t *glu)

{
  Scalar SVar1;
  int iVar2;
  int iVar3;
  Scalar SVar4;
  int iVar5;
  int iVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  int mem;
  int fsupc;
  int irow;
  int new_next;
  int segsize;
  int isub;
  int kfnz;
  int nextu;
  int i;
  int k;
  int jsupno;
  int ksupno;
  int krep;
  int ksub;
  IndexVector *perm_r_local;
  BlockIndexVector *repfnz_local;
  IndexVector *segrep_local;
  int nseg_local;
  int jcol_local;
  SparseLUImpl<double,_int> *this_local;
  
  pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                      (long)jcol);
  iVar2 = *pSVar7;
  nextu = nseg + -1;
  pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xusub,
                      (long)jcol);
  isub = *pSVar7;
  ksupno = 0;
  do {
    if (nseg <= ksupno) {
      pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xusub,
                          (long)(jcol + 1));
      *pSVar7 = isub;
      return 0;
    }
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)segrep,
                        (long)nextu);
    iVar5 = *pSVar7;
    nextu = nextu + -1;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                        (long)iVar5);
    iVar6 = *pSVar7;
    if (iVar2 != iVar6) {
      pSVar8 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)repfnz,(long)iVar5);
      iVar3 = *pSVar8;
      if (iVar3 != -1) {
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                            (long)iVar6);
        iVar6 = *pSVar7;
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                            (long)iVar6);
        new_next = (*pSVar7 + iVar3) - iVar6;
        iVar5 = (iVar5 - iVar3) + 1;
        while (glu->nzumax < isub + iVar5) {
          iVar6 = SparseLUImpl<double,int>::memXpand<Eigen::Matrix<double,_1,1,0,_1,1>>
                            ((SparseLUImpl<double,int> *)this,&glu->ucol,&glu->nzumax,isub,UCOL,
                             &glu->num_expansions);
          if (iVar6 != 0) {
            return iVar6;
          }
          iVar6 = SparseLUImpl<double,int>::memXpand<Eigen::Matrix<int,_1,1,0,_1,1>>
                            ((SparseLUImpl<double,int> *)this,&glu->usub,&glu->nzumax,isub,USUB,
                             &glu->num_expansions);
          if (iVar6 != 0) {
            return iVar6;
          }
        }
        for (kfnz = 0; kfnz < iVar5; kfnz = kfnz + 1) {
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                              (long)new_next);
          iVar6 = *pSVar7;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)perm_r,
                              (long)iVar6);
          SVar4 = *pSVar7;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->usub,
                              (long)isub);
          *pSVar7 = SVar4;
          pSVar9 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                 *)dense,(long)iVar6);
          SVar1 = *pSVar9;
          pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               &glu->ucol,(long)isub);
          *pSVar10 = SVar1;
          pSVar9 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                                 *)dense,(long)iVar6);
          *pSVar9 = 0.0;
          isub = isub + 1;
          new_next = new_next + 1;
        }
      }
    }
    ksupno = ksupno + 1;
  } while( true );
}

Assistant:

Index SparseLUImpl<Scalar,Index>::copy_to_ucol(const Index jcol, const Index nseg, IndexVector& segrep, BlockIndexVector repfnz ,IndexVector& perm_r, BlockScalarVector dense, GlobalLU_t& glu)
{  
  Index ksub, krep, ksupno; 
    
  Index jsupno = glu.supno(jcol);
  
  // For each nonzero supernode segment of U[*,j] in topological order 
  Index k = nseg - 1, i; 
  Index nextu = glu.xusub(jcol); 
  Index kfnz, isub, segsize; 
  Index new_next,irow; 
  Index fsupc, mem; 
  for (ksub = 0; ksub < nseg; ksub++)
  {
    krep = segrep(k); k--; 
    ksupno = glu.supno(krep); 
    if (jsupno != ksupno ) // should go into ucol(); 
    {
      kfnz = repfnz(krep); 
      if (kfnz != emptyIdxLU)
      { // Nonzero U-segment 
        fsupc = glu.xsup(ksupno); 
        isub = glu.xlsub(fsupc) + kfnz - fsupc; 
        segsize = krep - kfnz + 1; 
        new_next = nextu + segsize; 
        while (new_next > glu.nzumax) 
        {
          mem = memXpand<ScalarVector>(glu.ucol, glu.nzumax, nextu, UCOL, glu.num_expansions); 
          if (mem) return mem; 
          mem = memXpand<IndexVector>(glu.usub, glu.nzumax, nextu, USUB, glu.num_expansions); 
          if (mem) return mem; 
          
        }
        
        for (i = 0; i < segsize; i++)
        {
          irow = glu.lsub(isub); 
          glu.usub(nextu) = perm_r(irow); // Unlike the L part, the U part is stored in its final order
          glu.ucol(nextu) = dense(irow); 
          dense(irow) = Scalar(0.0); 
          nextu++;
          isub++;
        }
        
      } // end nonzero U-segment 
      
    } // end if jsupno 
    
  } // end for each segment
  glu.xusub(jcol + 1) = nextu; // close U(*,jcol)
  return 0; 
}